

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteSceneLibrary(ColladaExporter *this)

{
  char *pcVar1;
  ostream *poVar2;
  ulong local_f0;
  size_t a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string scene_name_escaped;
  ColladaExporter *this_local;
  
  scene_name_escaped.field_2._8_8_ = this;
  pcVar1 = aiString::C_Str(&this->mScene->mRootNode->mName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
  XMLEscape((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<library_visual_scenes>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PushTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a,
                 "<visual_scene id=\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a,
                 "\" name=\"");
  std::operator+(&local_a8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_88,&local_a8,"\">");
  poVar2 = std::operator<<(poVar2,(string *)&local_88);
  std::operator<<(poVar2,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&a);
  PushTag(this);
  for (local_f0 = 0; local_f0 < this->mScene->mRootNode->mNumChildren; local_f0 = local_f0 + 1) {
    WriteNode(this,this->mScene,this->mScene->mRootNode->mChildren[local_f0]);
  }
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"</visual_scene>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"</library_visual_scenes>");
  std::operator<<(poVar2,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void ColladaExporter::WriteSceneLibrary()
{
    const std::string scene_name_escaped = XMLEscape(mScene->mRootNode->mName.C_Str());

    mOutput << startstr << "<library_visual_scenes>" << endstr;
    PushTag();
    mOutput << startstr << "<visual_scene id=\"" + scene_name_escaped + "\" name=\"" + scene_name_escaped + "\">" << endstr;
    PushTag();

    // start recursive write at the root node
    for( size_t a = 0; a < mScene->mRootNode->mNumChildren; ++a )
        WriteNode( mScene, mScene->mRootNode->mChildren[a]);

    PopTag();
    mOutput << startstr << "</visual_scene>" << endstr;
    PopTag();
    mOutput << startstr << "</library_visual_scenes>" << endstr;
}